

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_predictive_coefficients_stability_check.cc
# Opt level: O2

bool __thiscall
sptk::LinearPredictiveCoefficientsStabilityCheck::Run
          (LinearPredictiveCoefficientsStabilityCheck *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *modified_linear_predictive_coefficients,
          bool *is_stable,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *parcor_coefficients;
  double dVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_type __new_size;
  ulong uVar8;
  double dVar9;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (buffer == (Buffer *)0x0) {
    return false;
  }
  if (is_stable == (bool *)0x0) {
    return false;
  }
  lVar6 = (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_start;
  __new_size = lVar6 >> 3;
  iVar4 = this->num_order_;
  if (__new_size == (long)iVar4 + 1U) {
    if (modified_linear_predictive_coefficients == (vector<double,_std::allocator<double>_> *)0x0) {
      *is_stable = true;
      if (iVar4 == 0) {
        return true;
      }
    }
    else {
      if ((long)(modified_linear_predictive_coefficients->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)(modified_linear_predictive_coefficients->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start != lVar6) {
        std::vector<double,_std::allocator<double>_>::resize
                  (modified_linear_predictive_coefficients,__new_size);
        iVar4 = this->num_order_;
      }
      *is_stable = true;
      if (iVar4 == 0) {
        *(modified_linear_predictive_coefficients->
         super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_start = *(linear_predictive_coefficients->
                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
        return true;
      }
    }
    parcor_coefficients = &buffer->parcor_coefficients_;
    bVar3 = LinearPredictiveCoefficientsToParcorCoefficients::Run
                      (&this->linear_predictive_coefficients_to_parcor_coefficients_,
                       linear_predictive_coefficients,parcor_coefficients,is_stable,
                       &buffer->conversion_buffer_);
    if (!bVar3) {
      return false;
    }
    if (modified_linear_predictive_coefficients != (vector<double,_std::allocator<double>_> *)0x0) {
      pdVar2 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar9 = 1.0 - this->margin_;
      uVar7 = 0;
      uVar5 = (ulong)(uint)this->num_order_;
      if (this->num_order_ < 1) {
        uVar5 = uVar7;
      }
      for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        dVar1 = pdVar2[uVar7 + 1];
        if (dVar9 < ABS(dVar1)) {
          uVar8 = -(ulong)(0.0 < dVar1);
          pdVar2[uVar7 + 1] = (double)(~uVar8 & (ulong)-dVar9 | uVar8 & (ulong)dVar9);
        }
      }
      bVar3 = ParcorCoefficientsToLinearPredictiveCoefficients::Run
                        (&this->parcor_coefficients_to_linear_predictive_coefficients_,
                         parcor_coefficients,modified_linear_predictive_coefficients,
                         &buffer->reconversion_buffer_);
      if (!bVar3) {
        return false;
      }
    }
    return true;
  }
  return false;
}

Assistant:

bool LinearPredictiveCoefficientsStabilityCheck::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* modified_linear_predictive_coefficients,
    bool* is_stable,
    LinearPredictiveCoefficientsStabilityCheck::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(num_order_ + 1) ||
      NULL == is_stable || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (NULL != modified_linear_predictive_coefficients &&
      modified_linear_predictive_coefficients->size() !=
          static_cast<std::size_t>(num_order_ + 1)) {
    modified_linear_predictive_coefficients->resize(num_order_ + 1);
  }

  // Handle a special case.
  *is_stable = true;
  if (0 == num_order_) {
    if (NULL != modified_linear_predictive_coefficients) {
      (*modified_linear_predictive_coefficients)[0] =
          linear_predictive_coefficients[0];
    }
    return true;
  }

  // Check stability.
  if (!linear_predictive_coefficients_to_parcor_coefficients_.Run(
          linear_predictive_coefficients, &buffer->parcor_coefficients_,
          is_stable, &buffer->conversion_buffer_)) {
    return false;
  }

  // Perform modification.
  if (NULL != modified_linear_predictive_coefficients) {
    double* parcor_coefficients(&buffer->parcor_coefficients_[0]);
    const double bound(1.0 - margin_);
    for (int m(1); m <= num_order_; ++m) {
      if (bound < std::fabs(parcor_coefficients[m])) {
        parcor_coefficients[m] =
            (0.0 < parcor_coefficients[m]) ? bound : -bound;
      }
    }
    if (!parcor_coefficients_to_linear_predictive_coefficients_.Run(
            buffer->parcor_coefficients_,
            modified_linear_predictive_coefficients,
            &buffer->reconversion_buffer_)) {
      return false;
    }
  }

  return true;
}